

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void svd_sort(double *U,int M,int N,double *V,double *q)

{
  size_t __size;
  long lVar1;
  void *__dest;
  void *__dest_00;
  void *__dest_01;
  int *pos;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar1 = (long)N;
  __size = lVar1 * 8;
  __dest = malloc((long)M * __size);
  __dest_00 = malloc(__size * lVar1);
  __dest_01 = malloc(__size);
  pos = (int *)malloc(lVar1 * 4);
  uVar5 = (ulong)(uint)N;
  if (0 < N) {
    memcpy(__dest_01,q,uVar5 * 8);
  }
  if (0 < N * M) {
    memcpy(__dest,U,(ulong)(uint)(N * M) << 3);
  }
  if (N != 0) {
    memcpy(__dest_00,V,(ulong)(N * N + (uint)(N * N == 0)) << 3);
  }
  sort1d(q,N,pos);
  if (0 < N) {
    uVar2 = 0;
    do {
      lVar1 = (long)pos[uVar2];
      q[uVar2] = *(double *)((long)__dest_01 + lVar1 * 8);
      if (0 < M) {
        lVar4 = 0;
        uVar3 = (ulong)(uint)M;
        do {
          *(undefined8 *)((long)U + lVar4) = *(undefined8 *)((long)__dest + lVar4 + lVar1 * 8);
          lVar4 = lVar4 + uVar5 * 8;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      lVar4 = 0;
      uVar3 = uVar5;
      do {
        *(undefined8 *)((long)V + lVar4) = *(undefined8 *)((long)__dest_00 + lVar4 + lVar1 * 8);
        lVar4 = lVar4 + uVar5 * 8;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      uVar2 = uVar2 + 1;
      U = U + 1;
      V = V + 1;
    } while (uVar2 != uVar5);
  }
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  free(pos);
  return;
}

Assistant:

void svd_sort(double *U,int M,int N,double *V,double *q) {
	/*
	 * Pavel Sakov's CSA SVD sort routine is used with some minor
	 * modifications. See The License below
	 */
	/*
	 * Copyright (C) 2000-2008 Pavel Sakov and CSIRO

Redistribution and use of material from the package `csa', with or without
modification, are permitted provided that the following conditions are
met:

1. Redistributions of material must retain the above copyright notice, this
list of conditions and the following disclaimer.
2. The names of the authors may not be used to endorse or promote products
derived from this software without specific prior written permission.

THIS SOFTWARE IS PROVIDED BY THE AUTHORS ``AS IS'' AND ANY EXPRESS OR IMPLIED
WARRANTIES, INCLUDING, BUT NOT LIMITED TO, THE IMPLIED WARRANTIES OF
MERCHANTABILITY AND FITNESS FOR A PARTICULAR PURPOSE ARE DISCLAIMED. IN NO
EVENT SHALL THE AUTHORS BE LIABLE FOR ANY DIRECT, INDIRECT, INCIDENTAL, SPECIAL,
EXEMPLARY, OR CONSEQUENTIAL DAMAGES (INCLUDING, BUT NOT LIMITED TO, PROCUREMENT
OF SUBSTITUTE GOODS OR SERVICES; LOSS OF USE, DATA, OR PROFITS; OR BUSINESS
INTERRUPTION) HOWEVER CAUSED AND ON ANY THEORY OF LIABILITY, WHETHER IN
CONTRACT, STRICT LIABILITY, OR TORT (INCLUDING NEGLIGENCE OR OTHERWISE) ARISING
IN ANY WAY OUT OF THE USE OF THIS SOFTWARE, EVEN IF ADVISED OF THE POSSIBILITY
OF SUCH DAMAGE.
	 */
	int i,j;
	double *UT,*VT,*qq;
	int *pos;

	UT = (double*) malloc(sizeof(double) * N * M);
	VT = (double*) malloc(sizeof(double) * N * N);
	qq = (double*) malloc(sizeof(double) * N);
	pos = (int*) malloc(sizeof(int) * N);

	for(i = 0;i < N;++i) {
		qq[i] = q[i];
	}

	for(i = 0;i < M*N;++i) {
		UT[i] = U[i];
	}

	for(i = 0;i < N*N;++i) {
		VT[i] = V[i];
	}

	//mtranspose(U,M,N,UT);
	//mtranspose(V,N,N,VT);

	sort1d(q,N,pos);

	for(i = 0; i < N;++i) {
		q[i] = qq[pos[i]];

		for (j = 0; j < M;++j) {
			U[j*N+i] = UT[j*N+pos[i]];
		}
		for (j = 0; j < N;++j) {
			V[j*N+i] = VT[j*N+pos[i]];
		}
	}

	free(UT);
	free(VT);
	free(qq);
	free(pos);

}